

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O0

void __thiscall
slang::ast::AssertionInstanceExpression::serializeTo
          (AssertionInstanceExpression *this,ASTSerializer *serializer)

{
  string_view name;
  bool bVar1;
  ASTSerializer *in_RSI;
  size_t in_RDI;
  Symbol *var;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ast::Symbol_*const,_18446744073709551615UL> *__range2;
  Symbol *in_stack_00000068;
  ASTSerializer *in_stack_00000070;
  string_view in_stack_00000078;
  ASTSerializer *this_00;
  char *in_stack_ffffffffffffff78;
  ASTSerializer *this_01;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff90;
  __normal_iterator<const_slang::ast::Symbol_*const_*,_std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>_>
  local_60;
  long local_58;
  int local_40;
  void *local_38;
  int local_30;
  void *local_28;
  ASTSerializer *local_10;
  
  local_10 = in_RSI;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  ASTSerializer::writeLink(in_stack_00000070,in_stack_00000078,in_stack_00000068);
  this_00 = local_10;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  ASTSerializer::write(this_00,local_30,local_28,*(size_t *)(in_RDI + 0x38));
  this_01 = local_10;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffff80,(char *)local_10);
  ASTSerializer::write(this_01,local_40,local_38,(ulong)(*(byte *)(in_RDI + 0x60) & 1));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)local_10,(char *)this_01);
  name._M_str = in_stack_ffffffffffffff90;
  name._M_len = in_RDI;
  ASTSerializer::startArray(local_10,name);
  local_58 = in_RDI + 0x50;
  local_60._M_current =
       (Symbol **)
       std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>::begin
                 ((span<const_slang::ast::Symbol_*const,_18446744073709551615UL> *)in_RSI);
  std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>::end
            ((span<const_slang::ast::Symbol_*const,_18446744073709551615UL> *)this_01);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_slang::ast::Symbol_*const_*,_std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::ast::Symbol_*const_*,_std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>_>
                        *)this_00,
                       (__normal_iterator<const_slang::ast::Symbol_*const_*,_std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>_>
                        *)in_RSI);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    __gnu_cxx::
    __normal_iterator<const_slang::ast::Symbol_*const_*,_std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>_>
    ::operator*(&local_60);
    ASTSerializer::serialize(this_00,(Symbol *)in_RSI,false);
    __gnu_cxx::
    __normal_iterator<const_slang::ast::Symbol_*const_*,_std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>_>
    ::operator++(&local_60);
  }
  ASTSerializer::endArray((ASTSerializer *)0xf23b8e);
  return;
}

Assistant:

void AssertionInstanceExpression::serializeTo(ASTSerializer& serializer) const {
    serializer.writeLink("symbol", symbol);
    serializer.write("body", body);
    serializer.write("isRecursiveProperty", isRecursiveProperty);

    serializer.startArray("localVars");
    for (auto var : localVars)
        serializer.serialize(*var);
    serializer.endArray();
}